

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::GetDiagonalCovariance
          (StatisticsAccumulation *this,Buffer *buffer,
          vector<double,_std::allocator<double>_> *diagonal_covariance)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  size_type __new_size;
  pointer pdVar5;
  int i;
  long lVar6;
  vector<double,_std::allocator<double>_> mean;
  undefined1 local_68 [24];
  double local_50;
  Row local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (this->num_statistics_order_ < 2) {
    return false;
  }
  iVar3 = buffer->zeroth_order_statistics_;
  if (diagonal_covariance == (vector<double,_std::allocator<double>_> *)0x0 || iVar3 < 1) {
LAB_00105f2b:
    bVar2 = false;
  }
  else {
    pdVar5 = (diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __new_size = (long)this->num_order_ + 1;
    if ((long)(diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar5 >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(diagonal_covariance,__new_size);
      iVar3 = buffer->zeroth_order_statistics_;
      pdVar5 = (diagonal_covariance->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    local_50 = 1.0 / (double)iVar3;
    if (this->numerically_stable_ == true) {
      for (lVar6 = 0; lVar6 <= this->num_order_; lVar6 = lVar6 + 1) {
        local_68._0_8_ = &PTR__Row_00115c40;
        local_68._16_4_ = (int)lVar6;
        local_68._8_8_ = &buffer->second_order_statistics_;
        pdVar4 = SymmetricMatrix::Row::operator[]((Row *)local_68,(int)lVar6);
        pdVar5[lVar6] = *pdVar4 * local_50;
      }
    }
    else {
      local_68._0_8_ = (_func_int **)0x0;
      local_68._8_8_ = (SymmetricMatrix *)0x0;
      local_68._16_8_ = (pointer)0x0;
      bVar2 = GetMean(this,buffer,(vector<double,_std::allocator<double>_> *)local_68);
      uVar1 = local_68._0_8_;
      if (!bVar2) {
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)local_68);
        goto LAB_00105f2b;
      }
      for (lVar6 = 0; lVar6 <= this->num_order_; lVar6 = lVar6 + 1) {
        local_48._vptr_Row = (_func_int **)&PTR__Row_00115c40;
        local_48.row_ = (int)lVar6;
        local_48.matrix_ = &buffer->second_order_statistics_;
        pdVar4 = SymmetricMatrix::Row::operator[](&local_48,local_48.row_);
        pdVar5[lVar6] =
             *pdVar4 * local_50 -
             (double)*(_func_int **)(uVar1 + lVar6 * 8) * (double)*(_func_int **)(uVar1 + lVar6 * 8)
        ;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)local_68);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool StatisticsAccumulation::GetDiagonalCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* diagonal_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == diagonal_covariance) {
    return false;
  }

  if (diagonal_covariance->size() != static_cast<std::size_t>(num_order_ + 1)) {
    diagonal_covariance->resize(num_order_ + 1);
  }

  const double z(1.0 / buffer.zeroth_order_statistics_);
  double* variance(&((*diagonal_covariance)[0]));

  if (numerically_stable_) {
    for (int i(0); i <= num_order_; ++i) {
      variance[i] = z * buffer.second_order_statistics_[i][i];
    }
  } else {
    std::vector<double> mean;
    if (!GetMean(buffer, &mean)) {
      return false;
    }
    const double* mu(&(mean[0]));
    for (int i(0); i <= num_order_; ++i) {
      variance[i] = z * buffer.second_order_statistics_[i][i] - mu[i] * mu[i];
    }
  }

  return true;
}